

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

Cba_Man_t * Cba_ManExtractGroup(Cba_Man_t *p,Vec_Int_t *vObjs)

{
  char *pFileName;
  Cba_Ntk_t *p_00;
  int iVar1;
  int iVar2;
  int iVar3;
  Abc_Nam_t *pStrs;
  Abc_Nam_t *pFuns;
  Abc_Nam_t *pMods;
  Hash_IntMan_t *vHash;
  int local_4c;
  int local_48;
  int nFons;
  int nFins;
  int nObjs;
  Vec_Int_t *vFonOuts;
  Vec_Int_t *vFonIns;
  Cba_Ntk_t *pRootNew;
  Cba_Ntk_t *pRoot;
  Cba_Man_t *pNew;
  Vec_Int_t *vObjs_local;
  Cba_Man_t *p_local;
  
  pFileName = p->pSpec;
  pNew = (Cba_Man_t *)vObjs;
  vObjs_local = (Vec_Int_t *)p;
  pStrs = Abc_NamRef(p->pStrs);
  pFuns = Abc_NamRef((Abc_Nam_t *)vObjs_local[1].pArray);
  pMods = Abc_NamStart(100,0x18);
  vHash = Hash_IntManRef((Hash_IntMan_t *)vObjs_local[2].pArray);
  pRoot = (Cba_Ntk_t *)Cba_ManAlloc(pFileName,1,pStrs,pFuns,pMods,vHash);
  pRootNew = Cba_ManRoot((Cba_Man_t *)vObjs_local);
  vFonOuts = Cba_NtkCollectInFons(pRootNew,(Vec_Int_t *)pNew);
  _nFins = Cba_NtkCollectOutFons(pRootNew,(Vec_Int_t *)pNew);
  Cba_ManDupTypeNames((Cba_Man_t *)pRoot,(Cba_Man_t *)vObjs_local);
  Cba_NtkCollectGroupStats(pRootNew,(Vec_Int_t *)pNew,&local_48,&local_4c);
  iVar1 = Vec_IntSize((Vec_Int_t *)pNew);
  iVar2 = Vec_IntSize(vFonOuts);
  iVar3 = Vec_IntSize(_nFins);
  nFons = iVar1 + iVar2 + iVar3;
  iVar1 = Vec_IntSize(_nFins);
  local_48 = iVar1 + local_48;
  iVar1 = Vec_IntSize(vFonOuts);
  p_00 = pRoot;
  local_4c = iVar1 + local_4c;
  iVar1 = Cba_NtkNameId(pRootNew);
  iVar2 = Vec_IntSize(vFonOuts);
  iVar3 = Vec_IntSize(_nFins);
  vFonIns = (Vec_Int_t *)Cba_NtkAlloc((Cba_Man_t *)p_00,iVar1,iVar2,iVar3,nFons,local_48,local_4c);
  Cba_NtkAdd((Cba_Man_t *)pRoot,(Cba_Ntk_t *)vFonIns);
  iVar1 = Cba_NtkHasObjNames(pRootNew);
  if (iVar1 != 0) {
    Cba_NtkCleanObjNames((Cba_Ntk_t *)vFonIns);
  }
  iVar1 = Cba_NtkHasFonNames(pRootNew);
  if (iVar1 != 0) {
    Cba_NtkCleanFonNames((Cba_Ntk_t *)vFonIns);
  }
  Cba_ManExtractGroupInt((Cba_Ntk_t *)vFonIns,pRootNew,(Vec_Int_t *)pNew,vFonOuts,_nFins);
  Cba_NtkMissingFonNames((Cba_Ntk_t *)vFonIns,"b");
  Vec_IntFree(vFonOuts);
  Vec_IntFree(_nFins);
  return (Cba_Man_t *)pRoot;
}

Assistant:

Cba_Man_t * Cba_ManExtractGroup( Cba_Man_t * p, Vec_Int_t * vObjs )
{
    Cba_Man_t * pNew  = Cba_ManAlloc( p->pSpec, 1, Abc_NamRef(p->pStrs), Abc_NamRef(p->pFuns), Abc_NamStart(100, 24), Hash_IntManRef(p->vHash) );
    Cba_Ntk_t * pRoot = Cba_ManRoot( p ), * pRootNew;
    Vec_Int_t * vFonIns = Cba_NtkCollectInFons( pRoot, vObjs );
    Vec_Int_t * vFonOuts = Cba_NtkCollectOutFons( pRoot, vObjs );
    int nObjs, nFins, nFons;
    Cba_ManDupTypeNames( pNew, p );
    // collect stats
    Cba_NtkCollectGroupStats( pRoot, vObjs, &nFins, &nFons );
    nObjs  = Vec_IntSize(vObjs) + Vec_IntSize(vFonIns) + Vec_IntSize(vFonOuts);
    nFins += Vec_IntSize(vFonOuts);
    nFons += Vec_IntSize(vFonIns);
    // create network
    pRootNew = Cba_NtkAlloc( pNew, Cba_NtkNameId(pRoot), Vec_IntSize(vFonIns), Vec_IntSize(vFonOuts), nObjs, nFins, nFons );
    Cba_NtkAdd( pNew, pRootNew );
    if ( Cba_NtkHasObjNames(pRoot) )
        Cba_NtkCleanObjNames( pRootNew );
    if ( Cba_NtkHasFonNames(pRoot) )
        Cba_NtkCleanFonNames( pRootNew );
    // add group nodes
    Cba_ManExtractGroupInt( pRootNew, pRoot, vObjs, vFonIns, vFonOuts );
    Cba_NtkMissingFonNames( pRootNew, "b" );
    //Cba_NtkPrepareSeq( pRootNew );
    // cleanup
    Vec_IntFree( vFonIns );
    Vec_IntFree( vFonOuts );
    return pNew;
}